

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetDefaults(ARKodeMem ark_mem)

{
  long in_RDI;
  int retval;
  sunindextype Cleniw;
  sunindextype Clenrw;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  SUNAdaptController in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    in_stack_ffffffffffffffe8->Ratolmin0 = 3;
    in_stack_ffffffffffffffe8->user_efun = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_setdefaults = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->user_data = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffe8->user_data + 4) = 1;
    *(undefined4 *)&in_stack_ffffffffffffffe8->reltol = 0;
    in_stack_ffffffffffffffe8->step_supports_implicit = 3;
    in_stack_ffffffffffffffe8->step_getestlocalerrors =
         (ARKTimestepGetEstLocalErrors)0x3fb999999999999a;
    in_stack_ffffffffffffffe8->step_setorder = (ARKTimestepSetOrder)0x3fd3333333333333;
    in_stack_ffffffffffffffe8->step_getnumrhsevals = (ARKTimestepGetNumRhsEvals)0x4002666666666666;
    in_stack_ffffffffffffffe8->step_printmem = (ARKTimestepPrintMem)0x3fc999999999999a;
    in_stack_ffffffffffffffe8->step_supports_relaxation = 0x14;
    *(undefined4 *)&in_stack_ffffffffffffffe8->efun = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_attachlinsol = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->field_0x12c = 0;
    in_stack_ffffffffffffffe8->step_disablelsetup = (ARKTimestepDisableLSetup)0x0;
    if ((in_stack_ffffffffffffffe8->step_setuserdata != (ARKTimetepSetUserDataFn)0x0) &&
       (*(int *)&in_stack_ffffffffffffffe8->step_printallstats != 0)) {
      SUNNonlinSolFree(in_stack_ffffffffffffffe8->step_setuserdata);
    }
    in_stack_ffffffffffffffe8->step_setuserdata = (ARKTimetepSetUserDataFn)0x0;
    if (in_stack_ffffffffffffffe8->VRabstol != (N_Vector)0x0) {
      MRIStepCoupling_Space
                ((MRIStepCoupling)in_stack_ffffffffffffffe8->VRabstol,
                 (sunindextype *)&stack0xffffffffffffffd8,(sunindextype *)&stack0xffffffffffffffe0);
      *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) - (long)in_stack_ffffffffffffffe0;
      *(long *)(in_RDI + 0x370) =
           *(long *)(in_RDI + 0x370) - CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
      ;
      MRIStepCoupling_Free((MRIStepCoupling)CONCAT44(local_4,in_stack_ffffffffffffffd0));
    }
    in_stack_ffffffffffffffe8->VRabstol = (N_Vector)0x0;
    local_4 = arkReplaceAdaptController
                        (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffdc);
    if (local_4 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  sunindextype Clenrw, Cleniw;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q              = 3;        /* method order */
  step_mem->p              = 0;        /* embedding order */
  step_mem->predictor      = 0;        /* trivial predictor */
  step_mem->linear         = SUNFALSE; /* nonlinear problem */
  step_mem->linear_timedep = SUNTRUE;  /* dfs/dy depends on t */
  step_mem->deduce_rhs     = SUNFALSE; /* deduce fi on result of NLS */
  step_mem->maxcor         = MAXCOR;   /* max nonlinear iters/stage */
  step_mem->nlscoef        = NLSCOEF;  /* nonlinear tolerance coefficient */
  step_mem->crdown         = CRDOWN; /* nonlinear convergence estimate coeff. */
  step_mem->rdiv           = RDIV;   /* nonlinear divergence tolerance */
  step_mem->dgmax          = DGMAX;  /* max gamma change to recompute J or P */
  step_mem->msbp           = MSBP;   /* max steps between updating J or P */
  step_mem->stages         = 0;      /* no stages */
  step_mem->istage         = 0;      /* current stage index */
  step_mem->jcur           = SUNFALSE;
  step_mem->convfail       = ARK_NO_FAILURES;
  step_mem->stage_predict  = NULL; /* no user-supplied stage predictor */

  /* Remove pre-existing nonlinear solver object */
  if (step_mem->NLS && step_mem->ownNLS) { SUNNonlinSolFree(step_mem->NLS); }
  step_mem->NLS = NULL;

  /* Remove pre-existing coupling table */
  if (step_mem->MRIC)
  {
    MRIStepCoupling_Space(step_mem->MRIC, &Cleniw, &Clenrw);
    ark_mem->lrw -= Clenrw;
    ark_mem->liw -= Cleniw;
    MRIStepCoupling_Free(step_mem->MRIC);
  }
  step_mem->MRIC = NULL;

  /* Load the default SUNAdaptController */
  retval = arkReplaceAdaptController(ark_mem, NULL, SUNTRUE);
  if (retval) { return retval; }

  return (ARK_SUCCESS);
}